

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_TestNonZeroStringMapEntriesHaveNoPresence_Test
::~NoFieldPresenceTest_TestNonZeroStringMapEntriesHaveNoPresence_Test
          (NoFieldPresenceTest_TestNonZeroStringMapEntriesHaveNoPresence_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroStringMapEntriesHaveNoPresence) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_bytes =
      desc->FindFieldByName("map_int32_bytes");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_bytes())[9] = "hello";
  const google::protobuf::Message& bytes_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_bytes, /*index=*/0);

  // Fields in map entries inherit field_presence from file defaults. If a map
  // is a "no presence" field, its key is also considered "no presence" from POV
  // of the descriptor. (Even though the key itself behaves like a normal index
  // with zeroes being valid indices). One day we will change this...
  EXPECT_THAT(bytes_map_entry, Not(MapEntryKeyExplicitPresence()));

  // Primitive types inherit presence semantics from the map itself.
  EXPECT_THAT(bytes_map_entry, Not(MapEntryValueExplicitPresence()));
}